

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::unShift(SPxSolverBase<double> *this)

{
  SPxSolverBase<double> *pSVar1;
  bool bVar2;
  Verbosity VVar3;
  Type TVar4;
  Representation RVar5;
  Type TVar6;
  DataKey *pDVar7;
  double *pdVar8;
  double dVar9;
  SPxSolverBase<double> *in_RDI;
  double dVar10;
  double eps_1;
  int l_num_1;
  SPxId l_id_1;
  int l_num;
  SPxId l_id;
  double eps;
  Desc *ds;
  double t_low;
  double t_up;
  int i;
  Verbosity old_verbosity;
  undefined4 in_stack_fffffffffffffe78;
  Status in_stack_fffffffffffffe7c;
  SPxSolverBase<double> *in_stack_fffffffffffffe80;
  SPxId *in_stack_fffffffffffffe88;
  SPxSolverBase<double> *pSVar11;
  SPxSolverBase<double> *in_stack_fffffffffffffe90;
  DataKey local_4c;
  int local_44;
  DataKey local_40;
  double local_38;
  Desc *local_30;
  SPxSolverBase<double> *local_28;
  SPxSolverBase<double> *local_20;
  int local_14;
  undefined4 local_10;
  Verbosity local_c [3];
  
  if ((in_RDI->spxout != (SPxOut *)0x0) &&
     (VVar3 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar3)) {
    local_c[0] = SPxOut::getVerbosity(in_RDI->spxout);
    local_10 = 5;
    (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_10);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffffe80,
                       (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    soplex::operator<<((SPxOut *)in_stack_fffffffffffffe80,
                       (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    soplex::operator<<((SPxOut *)in_stack_fffffffffffffe80,
                       (_func_ostream_ptr_ostream_ptr *)
                       CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,local_c);
  }
  bVar2 = isInitialized(in_RDI);
  if (bVar2) {
    local_30 = SPxBasisBase<double>::desc(&in_RDI->super_SPxBasisBase<double>);
    in_RDI->theShift = 0.0;
    TVar4 = type(in_RDI);
    if (TVar4 == ENTER) {
      local_38 = entertol((SPxSolverBase<double> *)
                          CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      RVar5 = rep(in_RDI);
      if (RVar5 == COLUMN) {
        local_14 = dim((SPxSolverBase<double> *)0x250df9);
        while (0 < local_14) {
          local_14 = local_14 + -1;
          pDVar7 = &SPxBasisBase<double>::baseId
                              ((SPxBasisBase<double> *)in_stack_fffffffffffffe80,
                               in_stack_fffffffffffffe7c)->super_DataKey;
          local_40 = *pDVar7;
          local_44 = SPxLPBase<double>::number
                               (&in_stack_fffffffffffffe90->super_SPxLPBase<double>,
                                in_stack_fffffffffffffe88);
          TVar6 = SPxId::type((SPxId *)&local_40);
          if (TVar6 == ROW_ID) {
            pdVar8 = SPxLPBase<double>::lhs
                               (&in_stack_fffffffffffffe80->super_SPxLPBase<double>,
                                in_stack_fffffffffffffe7c);
            local_20 = (SPxSolverBase<double> *)((ulong)*pdVar8 ^ 0x8000000000000000);
            pdVar8 = SPxLPBase<double>::rhs
                               (&in_stack_fffffffffffffe80->super_SPxLPBase<double>,
                                in_stack_fffffffffffffe7c);
            local_28 = (SPxSolverBase<double> *)((ulong)*pdVar8 ^ 0x8000000000000000);
          }
          else {
            pdVar8 = SPxLPBase<double>::upper
                               (&in_stack_fffffffffffffe80->super_SPxLPBase<double>,
                                in_stack_fffffffffffffe7c);
            local_20 = (SPxSolverBase<double> *)*pdVar8;
            pdVar8 = SPxLPBase<double>::lower
                               (&in_stack_fffffffffffffe80->super_SPxLPBase<double>,
                                in_stack_fffffffffffffe7c);
            local_28 = (SPxSolverBase<double> *)*pdVar8;
          }
          if (((double)local_20 != (double)local_28) ||
             (NAN((double)local_20) || NAN((double)local_28))) {
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                in_stack_fffffffffffffe7c);
            pSVar11 = local_20;
            if ((double)local_20 + local_38 <= *pdVar8) {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              if ((double)local_20 < *pdVar8) {
                pdVar8 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                    in_stack_fffffffffffffe7c);
                in_RDI->theShift = (*pdVar8 - (double)local_20) + in_RDI->theShift;
              }
            }
            else {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              *pdVar8 = (double)pSVar11;
            }
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                in_stack_fffffffffffffe7c);
            pSVar11 = local_28;
            if (*pdVar8 <= (double)local_28 - local_38) {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              if (*pdVar8 < (double)local_28) {
                pdVar8 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                    in_stack_fffffffffffffe7c);
                in_RDI->theShift = in_RDI->theShift - (*pdVar8 - (double)local_28);
              }
            }
            else {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              *pdVar8 = (double)pSVar11;
            }
          }
          else {
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                in_stack_fffffffffffffe7c);
            if (*pdVar8 <= (double)local_20) {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              pSVar11 = local_28;
              if (*pdVar8 < (double)local_28) {
                pdVar8 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                    in_stack_fffffffffffffe7c);
                in_RDI->theShift = ((double)pSVar11 - *pdVar8) + in_RDI->theShift;
              }
            }
            else {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              in_RDI->theShift = (*pdVar8 - (double)local_20) + in_RDI->theShift;
            }
          }
        }
        local_14 = local_14 + -1;
        local_14 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x25121b);
        while (0 < local_14) {
          local_14 = local_14 + -1;
          SPxBasisBase<double>::Desc::rowStatus
                    ((Desc *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
          bVar2 = isBasic(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
          if (!bVar2) {
            pdVar8 = SPxLPBase<double>::lhs
                               (&in_stack_fffffffffffffe80->super_SPxLPBase<double>,
                                in_stack_fffffffffffffe7c);
            local_20 = (SPxSolverBase<double> *)((ulong)*pdVar8 ^ 0x8000000000000000);
            pdVar8 = SPxLPBase<double>::rhs
                               (&in_stack_fffffffffffffe80->super_SPxLPBase<double>,
                                in_stack_fffffffffffffe7c);
            local_28 = (SPxSolverBase<double> *)((ulong)*pdVar8 ^ 0x8000000000000000);
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                in_stack_fffffffffffffe7c);
            if ((double)local_20 < *pdVar8) {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              in_RDI->theShift = (*pdVar8 - (double)local_20) + in_RDI->theShift;
            }
            pSVar11 = local_28;
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                in_stack_fffffffffffffe7c);
            pSVar1 = local_28;
            if (*pdVar8 <= (double)pSVar11 && (double)pSVar11 != *pdVar8) {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              in_RDI->theShift = ((double)pSVar1 - *pdVar8) + in_RDI->theShift;
            }
          }
        }
        local_14 = local_14 + -1;
        local_14 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2513eb);
        while (0 < local_14) {
          local_14 = local_14 + -1;
          SPxBasisBase<double>::Desc::colStatus
                    ((Desc *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
          bVar2 = isBasic(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
          if (!bVar2) {
            pdVar8 = SPxLPBase<double>::upper
                               (&in_stack_fffffffffffffe80->super_SPxLPBase<double>,
                                in_stack_fffffffffffffe7c);
            local_20 = (SPxSolverBase<double> *)*pdVar8;
            pdVar8 = SPxLPBase<double>::lower
                               (&in_stack_fffffffffffffe80->super_SPxLPBase<double>,
                                in_stack_fffffffffffffe7c);
            local_28 = (SPxSolverBase<double> *)*pdVar8;
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                in_stack_fffffffffffffe7c);
            if ((double)local_20 < *pdVar8) {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              in_RDI->theShift = (*pdVar8 - (double)local_20) + in_RDI->theShift;
            }
            pSVar11 = local_28;
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                in_stack_fffffffffffffe7c);
            pSVar1 = local_28;
            if (*pdVar8 <= (double)pSVar11 && (double)pSVar11 != *pdVar8) {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              in_RDI->theShift = ((double)pSVar1 - *pdVar8) + in_RDI->theShift;
            }
          }
        }
      }
      else {
        local_14 = dim((SPxSolverBase<double> *)0x251592);
        while (0 < local_14) {
          local_14 = local_14 + -1;
          pDVar7 = &SPxBasisBase<double>::baseId
                              ((SPxBasisBase<double> *)in_stack_fffffffffffffe80,
                               in_stack_fffffffffffffe7c)->super_DataKey;
          local_4c = *pDVar7;
          SPxLPBase<double>::number
                    (&in_stack_fffffffffffffe90->super_SPxLPBase<double>,in_stack_fffffffffffffe88);
          local_28 = (SPxSolverBase<double> *)0x0;
          local_20 = (SPxSolverBase<double> *)0x0;
          TVar6 = SPxId::type((SPxId *)&local_4c);
          if (TVar6 == ROW_ID) {
            SPxBasisBase<double>::Desc::rowStatus
                      ((Desc *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
            clearDualBounds(in_stack_fffffffffffffe90,
                            (Status)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                            (double *)in_stack_fffffffffffffe80,
                            (double *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
            ;
          }
          else {
            SPxBasisBase<double>::Desc::colStatus
                      ((Desc *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
            clearDualBounds(in_stack_fffffffffffffe90,
                            (Status)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                            (double *)in_stack_fffffffffffffe80,
                            (double *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
            ;
          }
          pdVar8 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffe80,
                              in_stack_fffffffffffffe7c);
          dVar10 = *pdVar8;
          pdVar8 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffe80,
                              in_stack_fffffffffffffe7c);
          if ((dVar10 != *pdVar8) || (NAN(dVar10) || NAN(*pdVar8))) {
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                in_stack_fffffffffffffe7c);
            if (*pdVar8 <= (double)local_20) {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              in_RDI->theShift = in_RDI->theShift - (*pdVar8 - (double)local_20);
            }
            else {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              in_RDI->theShift = (*pdVar8 - (double)local_20) + in_RDI->theShift;
            }
          }
          else {
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                in_stack_fffffffffffffe7c);
            pSVar11 = local_20;
            if ((double)local_20 - local_38 <= *pdVar8) {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              if ((double)local_20 < *pdVar8) {
                pdVar8 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                    in_stack_fffffffffffffe7c);
                in_RDI->theShift = (*pdVar8 - (double)local_20) + in_RDI->theShift;
              }
            }
            else {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              *pdVar8 = (double)pSVar11;
            }
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                in_stack_fffffffffffffe7c);
            pSVar11 = local_28;
            if (*pdVar8 <= (double)local_28 + local_38) {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              if (*pdVar8 < (double)local_28) {
                pdVar8 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                    in_stack_fffffffffffffe7c);
                in_RDI->theShift = in_RDI->theShift - (*pdVar8 - (double)local_28);
              }
            }
            else {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              *pdVar8 = (double)pSVar11;
            }
          }
        }
        local_14 = local_14 + -1;
        local_14 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x25197d);
        while (0 < local_14) {
          local_14 = local_14 + -1;
          SPxBasisBase<double>::Desc::rowStatus
                    ((Desc *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
          bVar2 = isBasic(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
          if (!bVar2) {
            local_28 = (SPxSolverBase<double> *)0x0;
            local_20 = (SPxSolverBase<double> *)0x0;
            SPxBasisBase<double>::Desc::rowStatus
                      ((Desc *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
            clearDualBounds(in_stack_fffffffffffffe90,
                            (Status)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                            (double *)in_stack_fffffffffffffe80,
                            (double *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
            ;
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                in_stack_fffffffffffffe7c);
            if ((double)local_20 < *pdVar8) {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              in_RDI->theShift = (*pdVar8 - (double)local_20) + in_RDI->theShift;
            }
            pSVar11 = local_28;
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                in_stack_fffffffffffffe7c);
            pSVar1 = local_28;
            if (*pdVar8 <= (double)pSVar11 && (double)pSVar11 != *pdVar8) {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              in_RDI->theShift = ((double)pSVar1 - *pdVar8) + in_RDI->theShift;
            }
          }
        }
        local_14 = local_14 + -1;
        local_14 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x251b28);
        while (0 < local_14) {
          local_14 = local_14 + -1;
          SPxBasisBase<double>::Desc::colStatus
                    ((Desc *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
          bVar2 = isBasic(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
          if (!bVar2) {
            local_28 = (SPxSolverBase<double> *)0x0;
            local_20 = (SPxSolverBase<double> *)0x0;
            SPxBasisBase<double>::Desc::colStatus
                      ((Desc *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
            clearDualBounds(in_stack_fffffffffffffe90,
                            (Status)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                            (double *)in_stack_fffffffffffffe80,
                            (double *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
            ;
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                in_stack_fffffffffffffe7c);
            if ((double)local_20 < *pdVar8) {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              in_RDI->theShift = (*pdVar8 - (double)local_20) + in_RDI->theShift;
            }
            pSVar11 = local_28;
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                in_stack_fffffffffffffe7c);
            pSVar1 = local_28;
            if (*pdVar8 <= (double)pSVar11 && (double)pSVar11 != *pdVar8) {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              in_RDI->theShift = ((double)pSVar1 - *pdVar8) + in_RDI->theShift;
            }
          }
        }
      }
    }
    else {
      dVar10 = leavetol((SPxSolverBase<double> *)
                        CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      RVar5 = rep(in_RDI);
      if (RVar5 == COLUMN) {
        local_14 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x251d06);
        while (0 < local_14) {
          local_14 = local_14 + -1;
          pdVar8 = SPxLPBase<double>::maxRowObj
                             (&in_stack_fffffffffffffe80->super_SPxLPBase<double>,
                              in_stack_fffffffffffffe7c);
          local_28 = (SPxSolverBase<double> *)*pdVar8;
          local_20 = local_28;
          SPxBasisBase<double>::Desc::rowStatus
                    ((Desc *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
          clearDualBounds(in_stack_fffffffffffffe90,
                          (Status)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                          (double *)in_stack_fffffffffffffe80,
                          (double *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
          SPxBasisBase<double>::Desc::rowStatus
                    ((Desc *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
          bVar2 = isBasic(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
          if (bVar2) {
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                in_stack_fffffffffffffe7c);
            if (*pdVar8 <= (double)local_20) {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              pSVar11 = local_28;
              if (*pdVar8 < (double)local_28) {
                pdVar8 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                    in_stack_fffffffffffffe7c);
                in_RDI->theShift = ((double)pSVar11 - *pdVar8) + in_RDI->theShift;
              }
            }
            else {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              in_RDI->theShift = (*pdVar8 - (double)local_20) + in_RDI->theShift;
            }
          }
          else {
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                in_stack_fffffffffffffe7c);
            pSVar11 = local_20;
            if ((double)local_20 + dVar10 <= *pdVar8) {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              in_RDI->theShift = (*pdVar8 - (double)local_20) + in_RDI->theShift;
            }
            else {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              pSVar1 = local_28;
              *pdVar8 = (double)pSVar11;
              if (((double)local_20 == (double)local_28) &&
                 (!NAN((double)local_20) && !NAN((double)local_28))) {
                pdVar8 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                    in_stack_fffffffffffffe7c);
                *pdVar8 = (double)pSVar1;
              }
            }
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                in_stack_fffffffffffffe7c);
            pSVar11 = local_28;
            if (*pdVar8 <= (double)local_28 - dVar10) {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              in_RDI->theShift = ((double)pSVar11 - *pdVar8) + in_RDI->theShift;
            }
            else {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              pSVar1 = local_20;
              *pdVar8 = (double)pSVar11;
              if (((double)local_20 == (double)local_28) &&
                 (!NAN((double)local_20) && !NAN((double)local_28))) {
                pdVar8 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                    in_stack_fffffffffffffe7c);
                *pdVar8 = (double)pSVar1;
              }
            }
          }
        }
        local_14 = local_14 + -1;
        local_14 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2520e7);
        while (0 < local_14) {
          local_14 = local_14 + -1;
          pdVar8 = SPxLPBase<double>::maxObj
                             (&in_stack_fffffffffffffe80->super_SPxLPBase<double>,
                              in_stack_fffffffffffffe7c);
          local_28 = (SPxSolverBase<double> *)((ulong)*pdVar8 ^ 0x8000000000000000);
          local_20 = local_28;
          SPxBasisBase<double>::Desc::colStatus
                    ((Desc *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
          clearDualBounds(in_stack_fffffffffffffe90,
                          (Status)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                          (double *)in_stack_fffffffffffffe80,
                          (double *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
          SPxBasisBase<double>::Desc::colStatus
                    ((Desc *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
          bVar2 = isBasic(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
          if (bVar2) {
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                in_stack_fffffffffffffe7c);
            if (*pdVar8 <= -(double)local_20) {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              if (*pdVar8 < -(double)local_28) {
                dVar9 = -(double)local_28;
                pdVar8 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                    in_stack_fffffffffffffe7c);
                in_RDI->theShift = (dVar9 - *pdVar8) + in_RDI->theShift;
              }
            }
            else {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              in_RDI->theShift = (*pdVar8 - -(double)local_20) + in_RDI->theShift;
            }
          }
          else {
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                in_stack_fffffffffffffe7c);
            if (-(double)local_20 + dVar10 <= *pdVar8) {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              in_RDI->theShift = (*pdVar8 - -(double)local_20) + in_RDI->theShift;
            }
            else {
              dVar9 = -(double)local_20;
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              *pdVar8 = dVar9;
              if (((double)local_20 == (double)local_28) &&
                 (!NAN((double)local_20) && !NAN((double)local_28))) {
                dVar9 = -(double)local_28;
                pdVar8 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                    in_stack_fffffffffffffe7c);
                *pdVar8 = dVar9;
              }
            }
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                in_stack_fffffffffffffe7c);
            if (*pdVar8 <= -(double)local_28 - dVar10) {
              dVar9 = -(double)local_28;
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              in_RDI->theShift = (dVar9 - *pdVar8) + in_RDI->theShift;
            }
            else {
              dVar9 = -(double)local_28;
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              *pdVar8 = dVar9;
              if (((double)local_20 == (double)local_28) &&
                 (!NAN((double)local_20) && !NAN((double)local_28))) {
                dVar9 = -(double)local_20;
                pdVar8 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                    in_stack_fffffffffffffe7c);
                *pdVar8 = dVar9;
              }
            }
          }
        }
      }
      else {
        local_14 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2525e6);
        while (0 < local_14) {
          local_14 = local_14 + -1;
          pdVar8 = SPxLPBase<double>::rhs
                             (&in_stack_fffffffffffffe80->super_SPxLPBase<double>,
                              in_stack_fffffffffffffe7c);
          local_20 = (SPxSolverBase<double> *)*pdVar8;
          pdVar8 = SPxLPBase<double>::lhs
                             (&in_stack_fffffffffffffe80->super_SPxLPBase<double>,
                              in_stack_fffffffffffffe7c);
          local_28 = (SPxSolverBase<double> *)*pdVar8;
          if (((double)local_20 != (double)local_28) ||
             (NAN((double)local_20) || NAN((double)local_28))) {
            SPxBasisBase<double>::Desc::rowStatus
                      ((Desc *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
            bVar2 = isBasic(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
            if (bVar2) {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              if (*pdVar8 <= (double)local_20) {
                pdVar8 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                    in_stack_fffffffffffffe7c);
                pSVar11 = local_28;
                if (*pdVar8 < (double)local_28) {
                  pdVar8 = VectorBase<double>::operator[]
                                     ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                      in_stack_fffffffffffffe7c);
                  in_RDI->theShift = ((double)pSVar11 - *pdVar8) + in_RDI->theShift;
                }
              }
              else {
                pdVar8 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                    in_stack_fffffffffffffe7c);
                in_RDI->theShift = (*pdVar8 - (double)local_20) + in_RDI->theShift;
              }
            }
            else {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              pSVar11 = local_20;
              if ((double)local_20 + dVar10 <= *pdVar8) {
                pdVar8 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                    in_stack_fffffffffffffe7c);
                in_RDI->theShift = (*pdVar8 - (double)local_20) + in_RDI->theShift;
              }
              else {
                pdVar8 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                    in_stack_fffffffffffffe7c);
                *pdVar8 = (double)pSVar11;
              }
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              pSVar11 = local_28;
              if (*pdVar8 <= (double)local_28 - dVar10) {
                pdVar8 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                    in_stack_fffffffffffffe7c);
                in_RDI->theShift = ((double)pSVar11 - *pdVar8) + in_RDI->theShift;
              }
              else {
                pdVar8 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                    in_stack_fffffffffffffe7c);
                *pdVar8 = (double)pSVar11;
              }
            }
          }
          else {
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                in_stack_fffffffffffffe7c);
            pSVar11 = local_28;
            if (*pdVar8 <= (double)local_20) {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              in_RDI->theShift = ((double)pSVar11 - *pdVar8) + in_RDI->theShift;
            }
            else {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              in_RDI->theShift = (*pdVar8 - (double)local_20) + in_RDI->theShift;
            }
          }
        }
        local_14 = local_14 + -1;
        local_14 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2529cc);
        while (0 < local_14) {
          local_14 = local_14 + -1;
          pdVar8 = SPxLPBase<double>::upper
                             (&in_stack_fffffffffffffe80->super_SPxLPBase<double>,
                              in_stack_fffffffffffffe7c);
          local_20 = (SPxSolverBase<double> *)*pdVar8;
          pdVar8 = SPxLPBase<double>::lower
                             (&in_stack_fffffffffffffe80->super_SPxLPBase<double>,
                              in_stack_fffffffffffffe7c);
          local_28 = (SPxSolverBase<double> *)*pdVar8;
          if (((double)local_20 != (double)local_28) ||
             (NAN((double)local_20) || NAN((double)local_28))) {
            SPxBasisBase<double>::Desc::colStatus
                      ((Desc *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
            bVar2 = isBasic(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
            if (bVar2) {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              if (*pdVar8 <= (double)local_20) {
                pdVar8 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                    in_stack_fffffffffffffe7c);
                if (*pdVar8 < (double)local_28) {
                  in_stack_fffffffffffffe80 = local_28;
                  pdVar8 = VectorBase<double>::operator[]
                                     ((VectorBase<double> *)local_28,in_stack_fffffffffffffe7c);
                  in_RDI->theShift =
                       ((double)in_stack_fffffffffffffe80 - *pdVar8) + in_RDI->theShift;
                }
              }
              else {
                pdVar8 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                    in_stack_fffffffffffffe7c);
                in_RDI->theShift = (*pdVar8 - (double)local_20) + in_RDI->theShift;
              }
            }
            else {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              pSVar11 = local_20;
              if ((double)local_20 + dVar10 <= *pdVar8) {
                pdVar8 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                    in_stack_fffffffffffffe7c);
                in_RDI->theShift = (*pdVar8 - (double)local_20) + in_RDI->theShift;
              }
              else {
                pdVar8 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                    in_stack_fffffffffffffe7c);
                *pdVar8 = (double)pSVar11;
              }
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              if (*pdVar8 <= (double)local_28 - dVar10) {
                pSVar11 = local_28;
                pdVar8 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                    in_stack_fffffffffffffe7c);
                in_RDI->theShift = ((double)pSVar11 - *pdVar8) + in_RDI->theShift;
              }
              else {
                pSVar11 = local_28;
                pdVar8 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                    in_stack_fffffffffffffe7c);
                *pdVar8 = (double)pSVar11;
              }
            }
          }
          else {
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                in_stack_fffffffffffffe7c);
            pSVar11 = local_28;
            if (*pdVar8 <= (double)local_20) {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              in_RDI->theShift = ((double)pSVar11 - *pdVar8) + in_RDI->theShift;
            }
            else {
              pdVar8 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c);
              in_RDI->theShift = (*pdVar8 - (double)local_20) + in_RDI->theShift;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::unShift(void)
{
   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "DSHIFT07 = " << "unshifting ..." << std::endl;);

   if(isInitialized())
   {
      int i;
      R t_up, t_low;
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      theShift = 0;

      if(type() == ENTER)
      {
         R eps = entertol();

         if(rep() == COLUMN)
         {
            for(i = dim(); i-- > 0;)
            {
               SPxId l_id = this->baseId(i);
               int l_num = this->number(l_id);

               if(l_id.type() == SPxId::ROW_ID)
               {
                  t_up = -this->lhs(l_num);
                  t_low = -this->rhs(l_num);
               }
               else
               {
                  assert(l_id.type() == SPxId::COL_ID);
                  t_up = this->upper(l_num);
                  t_low = this->lower(l_num);
               }

               if(t_up != t_low)
               {
                  if((*theFvec)[i] < t_up + eps)  // check allowed violation
                     theUBbound[i] = t_up; // reset shifted bound to original
                  else if((*theFvec)[i] > t_up)  // shifted bound is required for feasibility
                     theShift += theUBbound[i] - t_up;

                  if((*theFvec)[i] > t_low - eps)  // check allowed violation
                     theLBbound[i] = t_low; // reset shifted bound to original
                  else if((*theFvec)[i] < t_low)  // shifted bound is required for feasibility
                     theShift -= theLBbound[i] - t_low;
               }
               else
               {
                  if(theUBbound[i] > t_up)
                     theShift += theUBbound[i] - t_up;
                  else if(theLBbound[i] < t_low)
                     theShift += t_low - theLBbound[i];
               }
            }

            for(i = this->nRows(); i-- > 0;)
            {
               if(!isBasic(ds.rowStatus(i)))
               {
                  t_up = -this->lhs(i);
                  t_low = -this->rhs(i);

                  if(theURbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theURbound[i] - t_up;

                  if(t_low > theLRbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLRbound[i];
               }
            }

            for(i = this->nCols(); i-- > 0;)
            {
               if(!isBasic(ds.colStatus(i)))
               {
                  t_up = this->upper(i);
                  t_low = this->lower(i);

                  if(theUCbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theUCbound[i] - t_up;

                  if(t_low > theLCbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLCbound[i];
               }
            }
         }
         else
         {
            assert(rep() == ROW);

            for(i = dim(); i-- > 0;)
            {
               SPxId l_id = this->baseId(i);
               int l_num = this->number(l_id);
               t_up = t_low = 0;

               if(l_id.type() == SPxId::ROW_ID)
                  clearDualBounds(ds.rowStatus(l_num), t_up, t_low);
               else
                  clearDualBounds(ds.colStatus(l_num), t_up, t_low);

               if(theUBbound[i] != theLBbound[i])
               {
                  if(theUBbound[i] > t_up)
                     theShift += theUBbound[i] - t_up;
                  else
                     theShift -= theUBbound[i] - t_up;
               }
               else
               {
                  /* if the basic (primal or dual) variable is fixed (e.g., basis status P_FREE in row representation)
                   * then shiftFvec() and shiftPvec() do not relax the bounds, but shift both, hence they may be outside
                   * of [t_low,t_up] */
                  assert(theLBbound[i] == theUBbound[i] || theUBbound[i] >= t_up);
                  assert(theLBbound[i] == theUBbound[i] || theLBbound[i] <= t_low);

                  if((*theFvec)[i] < t_up - eps)
                     theUBbound[i] = t_up;
                  else if((*theFvec)[i] > t_up)
                     theShift += theUBbound[i] - t_up;

                  if((*theFvec)[i] > t_low + eps)
                     theLBbound[i] = t_low;
                  else if((*theFvec)[i] < t_low)
                     theShift -= theLBbound[i] - t_low;
               }
            }

            for(i = this->nRows(); i-- > 0;)
            {
               if(!isBasic(ds.rowStatus(i)))
               {
                  t_up = t_low = 0;
                  clearDualBounds(ds.rowStatus(i), t_up, t_low);

                  if(theURbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theURbound[i] - t_up;

                  if(t_low > theLRbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLRbound[i];
               }
            }

            for(i = this->nCols(); i-- > 0;)
            {
               if(!isBasic(ds.colStatus(i)))
               {
                  t_up = t_low = 0;
                  clearDualBounds(ds.colStatus(i), t_up, t_low);

                  if(theUCbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theUCbound[i] - t_up;

                  if(t_low > theLCbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLCbound[i];
               }
            }
         }
      }
      else
      {
         assert(type() == LEAVE);

         R eps = leavetol();

         if(rep() == COLUMN)
         {
            for(i = this->nRows(); i-- > 0;)
            {
               t_up = t_low = this->maxRowObj(i);
               clearDualBounds(ds.rowStatus(i), t_up, t_low);

               if(!isBasic(ds.rowStatus(i)))
               {
                  if((*theCoPvec)[i] < t_up + eps)
                  {
                     theURbound[i] = t_up; // reset bound to original value

                     if(t_up == t_low)
                        theLRbound[i] = t_low; // for fixed rows we change both bounds
                  }
                  else
                     theShift += theURbound[i] - t_up;

                  if((*theCoPvec)[i] > t_low - eps)
                  {
                     theLRbound[i] = t_low; // reset bound to original value

                     if(t_up == t_low)
                        theURbound[i] = t_up; // for fixed rows we change both bounds
                  }
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(theURbound[i] > t_up)
                  theShift += theURbound[i] - t_up;
               else if(theLRbound[i] < t_low)
                  theShift += t_low - theLRbound[i];
            }

            for(i = this->nCols(); i-- > 0;)
            {
               t_up = t_low = -this->maxObj(i);
               clearDualBounds(ds.colStatus(i), t_low, t_up);

               if(!isBasic(ds.colStatus(i)))
               {
                  if((*thePvec)[i] < -t_up + eps)
                  {
                     theUCbound[i] = -t_up; // reset bound to original value

                     if(t_up == t_low)
                        theLCbound[i] = -t_low; // for fixed variables we change both bounds
                  }
                  else
                     theShift += theUCbound[i] - (-t_up);

                  if((*thePvec)[i] > -t_low - eps)
                  {
                     theLCbound[i] = -t_low; // reset bound to original value

                     if(t_up == t_low)
                        theUCbound[i] = -t_up; // for fixed variables we change both bounds
                  }
                  else
                     theShift += (-t_low) - theLCbound[i];
               }
               else if(theUCbound[i] > -t_up)
                  theShift += theUCbound[i] - (-t_up);
               else if(theLCbound[i] < -t_low)
                  theShift += (-t_low) - theLCbound[i];
            }
         }
         else
         {
            assert(rep() == ROW);

            for(i = this->nRows(); i-- > 0;)
            {
               t_up = this->rhs(i);
               t_low = this->lhs(i);

               if(t_up == t_low)
               {
                  if(theURbound[i] > t_up)
                     theShift += theURbound[i] - t_up;
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(!isBasic(ds.rowStatus(i)))
               {
                  if((*thePvec)[i] < t_up + eps)
                     theURbound[i] = t_up; // reset bound to original value
                  else
                     theShift += theURbound[i] - t_up;

                  if((*thePvec)[i] > t_low - eps)
                     theLRbound[i] = t_low; // reset bound to original value
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(theURbound[i] > t_up)
                  theShift += theURbound[i] - t_up;
               else if(theLRbound[i] < t_low)
                  theShift += t_low - theLRbound[i];
            }

            for(i = this->nCols(); i-- > 0;)
            {
               t_up = this->upper(i);
               t_low = this->lower(i);

               if(t_up == t_low)
               {
                  if(theUCbound[i] > t_up)
                     theShift += theUCbound[i] - t_up;
                  else
                     theShift += t_low - theLCbound[i];
               }
               else if(!isBasic(ds.colStatus(i)))
               {
                  if((*theCoPvec)[i] < t_up + eps)
                     theUCbound[i] = t_up; // reset bound to original value
                  else
                     theShift += theUCbound[i] - t_up;

                  if((*theCoPvec)[i] > t_low - eps)
                     theLCbound[i] = t_low; // reset bound to original value
                  else
                     theShift += t_low - theLCbound[i];
               }
               else if(theUCbound[i] > t_up)
                  theShift += theUCbound[i] - t_up;
               else if(theLCbound[i] < t_low)
                  theShift += t_low - theLCbound[i];
            }
         }
      }
   }
}